

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O1

void plutovg_paint_destroy(plutovg_paint_t *paint)

{
  plutovg_texture_paint_t *texture;
  
  if ((paint != (plutovg_paint_t *)0x0) &&
     (paint->ref_count = paint->ref_count + -1, paint->ref_count == 0)) {
    if (paint->type == PLUTOVG_PAINT_TYPE_TEXTURE) {
      plutovg_surface_destroy((plutovg_surface_t *)paint[5]);
    }
    free(paint);
    return;
  }
  return;
}

Assistant:

void plutovg_paint_destroy(plutovg_paint_t* paint)
{
    if(paint == NULL)
        return;
    if(--paint->ref_count == 0) {
        if(paint->type == PLUTOVG_PAINT_TYPE_TEXTURE) {
            plutovg_texture_paint_t* texture = (plutovg_texture_paint_t*)(paint);
            plutovg_surface_destroy(texture->surface);
        }

        free(paint);
    }
}